

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::PyiGenerator::ExtraInitTypes_abi_cxx11_
          (string *__return_storage_ptr__,PyiGenerator *this,Descriptor *msg_des)

{
  bool bVar1;
  allocator<char> *__a;
  char *pcVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  pcVar2 = (msg_des->all_names_).payload_;
  __x._M_len = (ulong)*(ushort *)(pcVar2 + 2);
  __x._M_str = pcVar2 + ~__x._M_len;
  __y._M_str = "google.protobuf.Timestamp";
  __y._M_len = 0x19;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    pcVar2 = "datetime.datetime, ";
    __a = &local_11;
  }
  else {
    pcVar2 = (msg_des->all_names_).payload_;
    __x_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    __x_00._M_str = pcVar2 + ~__x_00._M_len;
    __y_00._M_str = "google.protobuf.Duration";
    __y_00._M_len = 0x18;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      pcVar2 = "datetime.timedelta, ";
      __a = &local_12;
    }
    else {
      pcVar2 = anon_var_dwarf_651463 + 5;
      __a = &local_13;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,pcVar2,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string PyiGenerator::ExtraInitTypes(const Descriptor& msg_des) const {
  if (msg_des.full_name() == "google.protobuf.Timestamp") {
    return "datetime.datetime, ";
  } else if (msg_des.full_name() == "google.protobuf.Duration") {
    return "datetime.timedelta, ";
  } else {
    return "";
  }
}